

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_horz_only_frame_superres_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29ca355::TestImage<unsigned_short>::TestImage
          (TestImage<unsigned_short> *this,int w_src,int h,int superres_denom,int x0,int bd)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  
  this->w_src_ = w_src;
  this->h_ = h;
  this->superres_denom_ = superres_denom;
  this->x0_ = x0;
  this->bd_ = bd;
  (this->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->src_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->dst_data_).super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar1 = w_src;
  if (superres_denom != 8) {
    iVar2 = superres_denom * w_src;
    iVar1 = iVar2 + 7;
    if (-1 < iVar2) {
      iVar1 = iVar2;
    }
    iVar1 = iVar1 >> 3;
  }
  this->w_dst_ = iVar1;
  uVar3 = w_src + 0x4fU & 0xfffffff0;
  this->src_stride_ = uVar3;
  this->dst_stride_ = iVar1 + 0x4fU & 0xfffffff0;
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->src_data_,(long)(int)((h + 0x40) * uVar3 * 2));
  std::vector<unsigned_short,_std::allocator<unsigned_short>_>::resize
            (&this->dst_data_,(long)((this->h_ + 0x40) * this->dst_stride_ * 2));
  return;
}

Assistant:

TestImage(int w_src, int h, int superres_denom, int x0, int bd)
      : w_src_(w_src), h_(h), superres_denom_(superres_denom), x0_(x0),
        bd_(bd) {
    assert(bd < 16);
    assert(bd <= 8 * static_cast<int>(sizeof(Pixel)));
    assert(9 <= superres_denom && superres_denom <= 16);
    assert(SCALE_NUMERATOR == 8);
    assert(0 <= x0_ && x0_ <= RS_SCALE_SUBPEL_MASK);

    w_dst_ = w_src_;
    calculate_unscaled_superres_size(&w_dst_, superres_denom);

    src_stride_ = ALIGN_POWER_OF_TWO(w_src_ + 2 * kHPad, 4);
    dst_stride_ = ALIGN_POWER_OF_TWO(w_dst_ + 2 * kHPad, 4);

    // Allocate image data
    src_data_.resize(2 * src_block_size());
    dst_data_.resize(2 * dst_block_size());
  }